

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.c
# Opt level: O3

png_uint_16 png_gamma_correct(png_structrp png_ptr,uint value,png_fixed_point gamma_val)

{
  double dVar1;
  
  if (png_ptr->bit_depth == '\b') {
    if (value - 1 < 0xfe) {
      dVar1 = pow((double)(int)value / 255.0,(double)gamma_val * 1e-05);
      dVar1 = floor(dVar1 * 255.0 + 0.5);
      value = (uint)dVar1;
    }
    value = value & 0xff;
  }
  else if (value - 1 < 0xfffe) {
    dVar1 = pow((double)(int)value / 65535.0,(double)gamma_val * 1e-05);
    dVar1 = floor(dVar1 * 65535.0 + 0.5);
    value = (uint)dVar1;
  }
  return (png_uint_16)value;
}

Assistant:

png_uint_16 /* PRIVATE */
png_gamma_correct(png_structrp png_ptr, unsigned int value,
    png_fixed_point gamma_val)
{
   if (png_ptr->bit_depth == 8)
      return png_gamma_8bit_correct(value, gamma_val);

#ifdef PNG_16BIT_SUPPORTED
   else
      return png_gamma_16bit_correct(value, gamma_val);
#else
      /* should not reach this */
      return 0;
#endif /* 16BIT */
}